

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O0

_vector3<float> * __thiscall xray_re::_vector3<float>::min(_vector3<float> *this,_vector3<float> *v)

{
  _vector3<float> *v_local;
  _vector3<float> *this_local;
  
  if ((v->field_0).field_0.x <= (this->field_0).field_0.x) {
    (this->field_0).field_0.x = (v->field_0).field_0.x;
  }
  if ((v->field_0).field_0.y <= (this->field_0).field_0.y) {
    (this->field_0).field_0.y = (v->field_0).field_0.y;
  }
  if ((v->field_0).field_0.z <= (this->field_0).field_0.z) {
    (this->field_0).field_0.z = (v->field_0).field_0.z;
  }
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::min(const _vector3<T>& v)
{
	if (x >= v.x)
		x = v.x;
	if (y >= v.y)
		y = v.y;
	if (z >= v.z)
		z = v.z;
	return *this;
}